

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O1

string * __thiscall
cornelich::cycle_formatter_yyyymmdd::date_from_cycle_impl_abi_cxx11_
          (string *__return_storage_ptr__,cycle_formatter_yyyymmdd *this,int64_t cycle)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sink;
  vector_type attr;
  uint local_7c;
  uint local_78;
  int local_74;
  string *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  string **local_58;
  int *local_50;
  uint *local_48;
  uint *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar3 = (this->super_cycle_formatter).m_cycle_length * cycle;
  uVar6 = SUB168(SEXT816(lVar3) * SEXT816(0x20c49ba5e353f7cf),8);
  lVar3 = lVar3 / 86400000;
  iVar4 = (int)lVar3 -
          (uint)((long)(((uVar6 >> 7) - ((long)uVar6 >> 0x3f)) * 1000000000) <
                lVar3 * 86400000000000);
  iVar2 = iVar4 + 0x8bfbc;
  if (-0xafa6d < iVar4) {
    iVar2 = iVar4 + 0xafa6c;
  }
  uVar1 = (iVar2 / 0x23ab1) * -0x23ab1 + iVar4 + 0xafa6c;
  uVar5 = ((uVar1 >> 2) / 0x23ab + uVar1) - (uVar1 / 0x23ab0 + (uVar1 >> 2) / 0x16d);
  iVar4 = (uVar1 - uVar5 / 0x5b4) + uVar5 / 0x8e94 + (uVar5 / 0x16d) * -0x16d;
  uVar1 = iVar4 * 5 + 2;
  local_78 = uVar1 / 0x99 + 3;
  if (0x5f9 < uVar1) {
    local_78 = uVar1 / 0x99 - 9;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_58 = &local_70;
  local_74 = (int)(short)((short)(iVar2 / 0x23ab1) * 400 +
                          (short)((uint)((ulong)uVar5 * 0x16719f361 >> 0x21) >> 8) +
                         (ushort)(local_78 < 3));
  local_50 = &local_74;
  local_78 = local_78 & 0xff;
  local_48 = &local_78;
  local_7c = (iVar4 - ((uVar1 / 0x99) * 0x99 + 2) / 5) + 1 & 0xff;
  local_40 = &local_7c;
  local_68 = 0;
  uStack_60 = 0;
  local_38 = 0x400003000;
  local_30 = 0x200003000;
  local_28 = 0x200003000;
  local_70 = __return_storage_ptr__;
  boost::spirit::karma::
  base_sequence<boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_int_generator<int,boost::spirit::unused_type,boost::spirit::unused_type,10u,false>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::nil_>>>,mpl_::bool_<false>,boost::spirit::karma::sequence<boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_int_generator<int,boost::spirit::unused_type,boost::spirit::unused_type,10u,false>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::nil_>>>>>
  ::
  generate_impl<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::__cxx11::string>,mpl_::int_<3>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::fusion::vector<int_const&,unsigned_int_const&,unsigned_int_const&>const,mpl_::bool_<false>,mpl_::bool_<false>>
            ((base_sequence<boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_int_generator<int,boost::spirit::unused_type,boost::spirit::unused_type,10u,false>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::nil_>>>,mpl_::bool_<false>,boost::spirit::karma::sequence<boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_int_generator<int,boost::spirit::unused_type,boost::spirit::unused_type,10u,false>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::cons<boost::spirit::karma::padding_right_alignment<boost::spirit::karma::any_uint_generator<unsigned_int,boost::spirit::unused_type,boost::spirit::unused_type,10u>,boost::spirit::karma::literal_char<boost::spirit::char_encoding::standard,boost::spirit::unused_type,true>,int>,boost::fusion::nil_>>>>>
              *)&local_38,&local_68,&boost::spirit::unused);
  return __return_storage_ptr__;
}

Assistant:

std::string cycle_formatter_yyyymmdd::date_from_cycle_impl(std::int64_t cycle) const
{
    const auto s = static_cast<std::time_t>(cycle * m_cycle_length / 1000);
    auto ts = system_clock::time_point(seconds(s));
    auto daypoint = floor<days>(ts);
    auto ymd = year_month_day(daypoint);

    using namespace boost::spirit;

    std::string result;
    std::back_insert_iterator<std::string> sink(result);
    karma::generate(sink,
                    karma::right_align(4, '0')[karma::int_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_],
            int(ymd.year()), unsigned(ymd.month()), unsigned(ymd.day()));
    return result;
}